

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O1

string * __thiscall
topk_algorithms::ThresholdAlgorithmInstance::ranks_str_abi_cxx11_
          (string *__return_storage_ptr__,ThresholdAlgorithmInstance *this)

{
  ulong *puVar1;
  Rank *pRVar2;
  ulong uVar3;
  long lVar4;
  string *psVar5;
  pointer puVar6;
  bool bVar7;
  pointer puVar8;
  ulong *puVar9;
  unsigned_long *r;
  long lVar10;
  undefined1 auVar11 [8];
  ulong uVar12;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  ulong *puVar13;
  unsigned_long local_1d8;
  stringstream ss;
  ostream local_1c8 [112];
  ios_base local_158 [264];
  string *local_50;
  undefined1 auStack_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ranks;
  
  auStack_48 = (undefined1  [8])0x0;
  ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar8 = (this->_rms_list)._ranks.
           super__Vector_base<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>,_std::allocator<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = __return_storage_ptr__;
  if ((this->_rms_list)._ranks.
      super__Vector_base<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>,_std::allocator<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar8) {
    uVar12 = 0;
    do {
      pRVar2 = puVar8[uVar12]._M_t.
               super___uniq_ptr_impl<rank::Rank,_std::default_delete<rank::Rank>_>._M_t.
               super__Tuple_impl<0UL,_rank::Rank_*,_std::default_delete<rank::Rank>_>.
               super__Head_base<0UL,_rank::Rank_*,_false>._M_head_impl;
      local_1d8 = ((long)*(pointer *)
                          ((long)&(pRVar2->_entries).
                                  super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_> + 8)
                   - *(long *)&(pRVar2->_entries).
                               super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl
                  >> 3) * -0x5555555555555555;
      if (ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,
                   (iterator)
                   ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_1d8);
      }
      else {
        *ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = local_1d8;
        ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      uVar12 = uVar12 + 1;
      puVar8 = (this->_rms_list)._ranks.
               super__Vector_base<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>,_std::allocator<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(this->_rms_list)._ranks.
                                    super__Vector_base<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>,_std::allocator<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3))
    ;
  }
  puVar6 = ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar11 = auStack_48;
  if (auStack_48 !=
      (undefined1  [8])
      ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar10 = (long)ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)auStack_48;
    uVar12 = lVar10 >> 3;
    lVar4 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<topk_algorithms::ThresholdAlgorithmInstance::ranks_str[abi:cxx11]()const::__0>>
              (auStack_48,
               ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar10 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<topk_algorithms::ThresholdAlgorithmInstance::ranks_str[abi:cxx11]()const::__0>>
                (auVar11,puVar6);
    }
    else {
      puVar13 = (ulong *)((long)auVar11 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<topk_algorithms::ThresholdAlgorithmInstance::ranks_str[abi:cxx11]()const::__0>>
                (auVar11,puVar13);
      for (; puVar13 != puVar6; puVar13 = puVar13 + 1) {
        uVar3 = *puVar13;
        uVar12 = puVar13[-1];
        puVar9 = puVar13;
        while (uVar12 < uVar3) {
          *puVar9 = uVar12;
          puVar1 = puVar9 + -2;
          puVar9 = puVar9 + -1;
          uVar12 = *puVar1;
        }
        *puVar9 = uVar3;
      }
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d8);
  puVar6 = ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (auStack_48 !=
      (undefined1  [8])
      ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar7 = true;
    auVar11 = auStack_48;
    do {
      if (!bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1c8,",",1);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
      auVar11 = (undefined1  [8])((long)auVar11 + 8);
      bVar7 = false;
    } while (auVar11 != (undefined1  [8])puVar6);
  }
  psVar5 = local_50;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1d8);
  std::ios_base::~ios_base(local_158);
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48);
  }
  return psVar5;
}

Assistant:

std::string ThresholdAlgorithmInstance::ranks_str() const {
        std::vector<Count> ranks;
        for (auto i=0;i<_rms_list.size();++i) { ranks.push_back(_rms_list.rank(i)->size()); }
        std::sort(ranks.begin(), ranks.end(), [](Count a, Count b) { return a > b; });
        std::stringstream ss;
        bool first = true;
        for (auto &r: ranks) {
            if (!first)
                ss << ",";
            ss << r;
            first = false;
        }
        return ss.str();
    }